

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::Generate(cmLocalNinjaGenerator *this)

{
  bool bVar1;
  uint uVar2;
  TargetType TVar3;
  int iVar4;
  string *psVar5;
  cmGlobalGenerator *pcVar6;
  cmGeneratedFileStream *pcVar7;
  cmMakefile *this_00;
  ulong uVar8;
  GeneratorTargetVector *this_01;
  pointer pcVar9;
  undefined4 extraout_var;
  cmGlobalNinjaGenerator *pcVar10;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar11;
  cmGlobalNinjaGenerator *pcVar12;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  pointer pcVar13;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar14;
  reference fileConfig;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_4;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  string local_5b0 [32];
  reference local_590;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_3;
  const_iterator __end5;
  const_iterator __begin5;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range5;
  string local_568;
  allocator<char> local_541;
  string local_540;
  undefined1 local_520 [8];
  cmNinjaBuild phonyAlias_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_2;
  iterator __end6;
  iterator __begin6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range6;
  string local_3d8;
  allocator<char> local_3b1;
  string local_3b0;
  undefined1 local_390 [8];
  cmNinjaBuild phonyAlias_2;
  string local_268;
  allocator<char> local_241;
  string local_240;
  undefined1 local_220 [8];
  cmNinjaBuild phonyAlias;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config_1;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_> tg;
  unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *target;
  const_iterator __end1;
  const_iterator __begin1;
  GeneratorTargetVector *__range1;
  string local_b0;
  allocator<char> local_79;
  string local_78;
  string *local_58;
  string *showIncludesPrefix;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmLocalNinjaGenerator *local_10;
  cmLocalNinjaGenerator *this_local;
  
  local_10 = this;
  psVar5 = cmLocalGenerator::GetCurrentBinaryDirectory_abi_cxx11_((cmLocalGenerator *)this);
  cmOutputConverter::MaybeRelativeToTopBinDir
            ((string *)&__range2,
             &(this->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             psVar5);
  std::__cxx11::string::operator=((string *)&this->HomeRelativeOutputPath,(string *)&__range2);
  std::__cxx11::string::~string((string *)&__range2);
  bVar1 = std::operator==(&this->HomeRelativeOutputPath,".");
  if (bVar1) {
    std::__cxx11::string::clear();
  }
  pcVar6 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)this);
  uVar2 = (*pcVar6->_vptr_cmGlobalGenerator[0x26])();
  if ((uVar2 & 1) != 0) {
    pvVar14 = cmLocalCommonGenerator::GetConfigNames_abi_cxx11_(&this->super_cmLocalCommonGenerator)
    ;
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar14);
    config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(pvVar14);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&config), bVar1) {
      showIncludesPrefix =
           __gnu_cxx::
           __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator*(&__end2);
      pcVar7 = GetImplFileStream(this,showIncludesPrefix);
      WriteProcessedMakefile(this,(ostream *)pcVar7);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  pcVar7 = GetCommonFileStream(this);
  WriteProcessedMakefile(this,(ostream *)pcVar7);
  bVar1 = cmLocalGenerator::IsRootMakefile((cmLocalGenerator *)this);
  if (bVar1) {
    WriteBuildFileTop(this);
    pcVar7 = GetRulesFileStream(this);
    WritePools(this,(ostream *)pcVar7);
    this_00 = cmLocalGenerator::GetMakefile((cmLocalGenerator *)this);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_78,"CMAKE_CL_SHOWINCLUDES_PREFIX",&local_79);
    psVar5 = cmMakefile::GetSafeDefinition(this_00,&local_78);
    std::__cxx11::string::~string((string *)&local_78);
    std::allocator<char>::~allocator(&local_79);
    local_58 = psVar5;
    uVar8 = std::__cxx11::string::empty();
    if ((uVar8 & 1) == 0) {
      pcVar7 = GetRulesFileStream(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_b0,"localized /showIncludes string",
                 (allocator<char> *)((long)&__range1 + 7));
      cmGlobalNinjaGenerator::WriteComment((ostream *)pcVar7,&local_b0);
      std::__cxx11::string::~string((string *)&local_b0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&__range1 + 7));
      pcVar7 = GetRulesFileStream(this);
      std::operator<<((ostream *)pcVar7,"msvc_deps_prefix = ");
      pcVar7 = GetRulesFileStream(this);
      cmGeneratedFileStream::WriteAltEncoding(pcVar7,local_58,ConsoleOutput);
      pcVar7 = GetRulesFileStream(this);
      std::operator<<((ostream *)pcVar7,"\n\n");
    }
  }
  this_01 = cmLocalGenerator::GetGeneratorTargets((cmLocalGenerator *)this);
  __end1 = std::
           vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ::begin(this_01);
  target = (unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
           std::
           vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
           ::end(this_01);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
                                     *)&target), bVar1) {
    tg._M_t.
    super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>._M_t
    .super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>.
    super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl =
         (__uniq_ptr_data<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>,_true,_true>
          )__gnu_cxx::
           __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
           ::operator*(&__end1);
    pcVar9 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::operator->
                       ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                        tg._M_t.
                        super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                        .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl);
    bVar1 = cmGeneratorTarget::IsInBuildSystem(pcVar9);
    if (bVar1) {
      pcVar9 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::get
                         ((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *)
                          tg._M_t.
                          super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                          .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl);
      cmNinjaTargetGenerator::New((cmNinjaTargetGenerator *)&__range4,pcVar9);
      bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&__range4);
      if (bVar1) {
        pcVar9 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                 operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             *)tg._M_t.
                               super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                               .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl)
        ;
        bVar1 = cmTarget::IsPerConfig(pcVar9->Target);
        if (bVar1) {
          pvVar14 = cmLocalCommonGenerator::GetConfigNames_abi_cxx11_
                              (&this->super_cmLocalCommonGenerator);
          __end4 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::begin(pvVar14);
          config_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::end(pvVar14);
          while (bVar1 = __gnu_cxx::operator!=
                                   (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                             *)&config_1), bVar1) {
            phonyAlias.RspFile.field_2._8_8_ =
                 __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end4);
            pcVar13 = std::
                      unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                      ::operator->((unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                                    *)&__range4);
            (*(pcVar13->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])
                      (pcVar13,phonyAlias.RspFile.field_2._8_8_);
            pcVar9 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                     operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 *)tg._M_t.
                                   super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                                   .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>.
                                   _M_head_impl);
            TVar3 = cmGeneratorTarget::GetType(pcVar9);
            if (TVar3 == GLOBAL_TARGET) {
              pcVar6 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)this);
              uVar2 = (*pcVar6->_vptr_cmGlobalGenerator[0x26])();
              if ((uVar2 & 1) != 0) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_240,"phony",&local_241);
                cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_220,&local_240);
                std::__cxx11::string::~string((string *)&local_240);
                std::allocator<char>::~allocator(&local_241);
                pcVar10 = GetGlobalNinjaGenerator(this);
                pcVar9 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ::get((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                *)tg._M_t.
                                  super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                                  .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>.
                                  _M_head_impl);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_268,"",
                           (allocator<char> *)(phonyAlias_2.RspFile.field_2._M_local_buf + 0xf));
                cmGlobalNinjaGenerator::AppendTargetOutputs
                          (pcVar10,pcVar9,(cmNinjaDeps *)((long)&phonyAlias.Rule.field_2 + 8),
                           &local_268,DependOnTargetArtifact);
                std::__cxx11::string::~string((string *)&local_268);
                std::allocator<char>::~allocator
                          ((allocator<char> *)(phonyAlias_2.RspFile.field_2._M_local_buf + 0xf));
                pcVar10 = GetGlobalNinjaGenerator(this);
                pcVar9 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ::get((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                *)tg._M_t.
                                  super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                                  .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>.
                                  _M_head_impl);
                cmGlobalNinjaGenerator::AppendTargetOutputs
                          (pcVar10,pcVar9,
                           (cmNinjaDeps *)
                           &phonyAlias.WorkDirOuts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                           (string *)phonyAlias.RspFile.field_2._8_8_,DependOnTargetArtifact);
                pcVar10 = GetGlobalNinjaGenerator(this);
                pcVar12 = GetGlobalNinjaGenerator(this);
                iVar4 = (*(pcVar12->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          _vptr_cmGlobalGenerator[0x42])(pcVar12,phonyAlias.RspFile.field_2._8_8_);
                cmGlobalNinjaGenerator::WriteBuild
                          (pcVar10,(ostream *)CONCAT44(extraout_var,iVar4),(cmNinjaBuild *)local_220
                           ,0,(bool *)0x0);
                cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_220);
              }
            }
            __gnu_cxx::
            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            ::operator++(&__end4);
          }
          pcVar9 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                   operator->((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                               *)tg._M_t.
                                 super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                                 .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>.
                                 _M_head_impl);
          TVar3 = cmGeneratorTarget::GetType(pcVar9);
          if (TVar3 == GLOBAL_TARGET) {
            pcVar6 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)this);
            uVar2 = (*pcVar6->_vptr_cmGlobalGenerator[0x26])();
            if ((uVar2 & 1) != 0) {
              pcVar10 = GetGlobalNinjaGenerator(this);
              psVar11 = cmGlobalNinjaGenerator::GetDefaultConfigs_abi_cxx11_(pcVar10);
              bVar1 = std::
                      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::empty(psVar11);
              if (!bVar1) {
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3b0,"phony",&local_3b1);
                cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_390,&local_3b0);
                std::__cxx11::string::~string((string *)&local_3b0);
                std::allocator<char>::~allocator(&local_3b1);
                pcVar10 = GetGlobalNinjaGenerator(this);
                pcVar9 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ::get((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                *)tg._M_t.
                                  super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                                  .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>.
                                  _M_head_impl);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_3d8,"",(allocator<char> *)((long)&__range6 + 7));
                cmGlobalNinjaGenerator::AppendTargetOutputs
                          (pcVar10,pcVar9,(cmNinjaDeps *)((long)&phonyAlias_2.Rule.field_2 + 8),
                           &local_3d8,DependOnTargetArtifact);
                std::__cxx11::string::~string((string *)&local_3d8);
                std::allocator<char>::~allocator((allocator<char> *)((long)&__range6 + 7));
                pcVar10 = GetGlobalNinjaGenerator(this);
                psVar11 = cmGlobalNinjaGenerator::GetDefaultConfigs_abi_cxx11_(pcVar10);
                __end6 = std::
                         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::begin(psVar11);
                config_2 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           std::
                           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::end(psVar11);
                while (bVar1 = std::operator!=(&__end6,(_Self *)&config_2), bVar1) {
                  phonyAlias_1.RspFile.field_2._8_8_ =
                       std::
                       _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       ::operator*(&__end6);
                  pcVar10 = GetGlobalNinjaGenerator(this);
                  pcVar9 = std::
                           unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                           get((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                *)tg._M_t.
                                  super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                                  .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>.
                                  _M_head_impl);
                  cmGlobalNinjaGenerator::AppendTargetOutputs
                            (pcVar10,pcVar9,
                             (cmNinjaDeps *)
                             &phonyAlias_2.WorkDirOuts.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,
                             (string *)phonyAlias_1.RspFile.field_2._8_8_,DependOnTargetArtifact);
                  std::
                  _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ::operator++(&__end6);
                }
                pcVar10 = GetGlobalNinjaGenerator(this);
                pcVar12 = GetGlobalNinjaGenerator(this);
                iVar4 = (*(pcVar12->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                          _vptr_cmGlobalGenerator[0x43])();
                cmGlobalNinjaGenerator::WriteBuild
                          (pcVar10,(ostream *)CONCAT44(extraout_var_00,iVar4),
                           (cmNinjaBuild *)local_390,0,(bool *)0x0);
                cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_390);
              }
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_540,"phony",&local_541);
              cmNinjaBuild::cmNinjaBuild((cmNinjaBuild *)local_520,&local_540);
              std::__cxx11::string::~string((string *)&local_540);
              std::allocator<char>::~allocator(&local_541);
              pcVar10 = GetGlobalNinjaGenerator(this);
              pcVar9 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>::
                       get((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_> *
                           )tg._M_t.
                            super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                            .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>._M_head_impl);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_568,"all",(allocator<char> *)((long)&__range5 + 7));
              cmGlobalNinjaGenerator::AppendTargetOutputs
                        (pcVar10,pcVar9,(cmNinjaDeps *)((long)&phonyAlias_1.Rule.field_2 + 8),
                         &local_568,DependOnTargetArtifact);
              std::__cxx11::string::~string((string *)&local_568);
              std::allocator<char>::~allocator((allocator<char> *)((long)&__range5 + 7));
              pvVar14 = cmLocalCommonGenerator::GetConfigNames_abi_cxx11_
                                  (&this->super_cmLocalCommonGenerator);
              __end5 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::begin(pvVar14);
              config_3 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::end(pvVar14);
              while (bVar1 = __gnu_cxx::operator!=
                                       (&__end5,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                                 *)&config_3), bVar1) {
                local_590 = __gnu_cxx::
                            __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            ::operator*(&__end5);
                pcVar10 = GetGlobalNinjaGenerator(this);
                pcVar9 = std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                         ::get((unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                *)tg._M_t.
                                  super___uniq_ptr_impl<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_cmNinjaTargetGenerator_*,_std::default_delete<cmNinjaTargetGenerator>_>
                                  .super__Head_base<0UL,_cmNinjaTargetGenerator_*,_false>.
                                  _M_head_impl);
                cmGlobalNinjaGenerator::AppendTargetOutputs
                          (pcVar10,pcVar9,
                           (cmNinjaDeps *)
                           &phonyAlias_1.WorkDirOuts.
                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_590,
                           DependOnTargetArtifact);
                __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator++(&__end5);
              }
              pcVar10 = GetGlobalNinjaGenerator(this);
              pcVar12 = GetGlobalNinjaGenerator(this);
              iVar4 = (*(pcVar12->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                        _vptr_cmGlobalGenerator[0x43])();
              cmGlobalNinjaGenerator::WriteBuild
                        (pcVar10,(ostream *)CONCAT44(extraout_var_01,iVar4),
                         (cmNinjaBuild *)local_520,0,(bool *)0x0);
              cmNinjaBuild::~cmNinjaBuild((cmNinjaBuild *)local_520);
            }
          }
        }
        else {
          pcVar13 = std::
                    unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                    ::operator->((unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                                  *)&__range4);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_5b0,"",(allocator<char> *)((long)&__range1_1 + 7));
          (*(pcVar13->super_cmCommonTargetGenerator)._vptr_cmCommonTargetGenerator[3])
                    (pcVar13,local_5b0);
          std::__cxx11::string::~string(local_5b0);
          std::allocator<char>::~allocator((allocator<char> *)((long)&__range1_1 + 7));
        }
      }
      std::unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>::
      ~unique_ptr((unique_ptr<cmNinjaTargetGenerator,_std::default_delete<cmNinjaTargetGenerator>_>
                   *)&__range4);
    }
    __gnu_cxx::
    __normal_iterator<const_std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_*,_std::vector<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>_>
    ::operator++(&__end1);
  }
  pvVar14 = cmLocalCommonGenerator::GetConfigNames_abi_cxx11_(&this->super_cmLocalCommonGenerator);
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar14);
  config_4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(pvVar14);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&config_4), bVar1) {
    fileConfig = __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end1_1);
    WriteCustomCommandBuildStatements(this,fileConfig);
    AdditionalCleanFiles(this,fileConfig);
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  return;
}

Assistant:

void cmLocalNinjaGenerator::Generate()
{
  // Compute the path to use when referencing the current output
  // directory from the top output directory.
  this->HomeRelativeOutputPath =
    this->MaybeRelativeToTopBinDir(this->GetCurrentBinaryDirectory());
  if (this->HomeRelativeOutputPath == ".") {
    this->HomeRelativeOutputPath.clear();
  }

  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    for (auto const& config : this->GetConfigNames()) {
      this->WriteProcessedMakefile(this->GetImplFileStream(config));
    }
  }
  this->WriteProcessedMakefile(this->GetCommonFileStream());
#ifdef NINJA_GEN_VERBOSE_FILES
  this->WriteProcessedMakefile(this->GetRulesFileStream());
#endif

  // We do that only once for the top CMakeLists.txt file.
  if (this->IsRootMakefile()) {
    this->WriteBuildFileTop();

    this->WritePools(this->GetRulesFileStream());

    const std::string& showIncludesPrefix =
      this->GetMakefile()->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
    if (!showIncludesPrefix.empty()) {
      cmGlobalNinjaGenerator::WriteComment(this->GetRulesFileStream(),
                                           "localized /showIncludes string");
      this->GetRulesFileStream() << "msvc_deps_prefix = ";
      // 'cl /showIncludes' encodes output in the console output code page.
      // It may differ from the encoding used for file paths in 'build.ninja'.
      // Ninja matches the showIncludes prefix using its raw byte sequence.
      this->GetRulesFileStream().WriteAltEncoding(
        showIncludesPrefix, cmGeneratedFileStream::Encoding::ConsoleOutput);
      this->GetRulesFileStream() << "\n\n";
    }
  }

  for (const auto& target : this->GetGeneratorTargets()) {
    if (!target->IsInBuildSystem()) {
      continue;
    }
    auto tg = cmNinjaTargetGenerator::New(target.get());
    if (tg) {
      if (target->Target->IsPerConfig()) {
        for (auto const& config : this->GetConfigNames()) {
          tg->Generate(config);
          if (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
              this->GetGlobalGenerator()->IsMultiConfig()) {
            cmNinjaBuild phonyAlias("phony");
            this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
              target.get(), phonyAlias.Outputs, "", DependOnTargetArtifact);
            this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
              target.get(), phonyAlias.ExplicitDeps, config,
              DependOnTargetArtifact);
            this->GetGlobalNinjaGenerator()->WriteBuild(
              *this->GetGlobalNinjaGenerator()->GetConfigFileStream(config),
              phonyAlias);
          }
        }
        if (target->GetType() == cmStateEnums::GLOBAL_TARGET &&
            this->GetGlobalGenerator()->IsMultiConfig()) {
          if (!this->GetGlobalNinjaGenerator()->GetDefaultConfigs().empty()) {
            cmNinjaBuild phonyAlias("phony");
            this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
              target.get(), phonyAlias.Outputs, "", DependOnTargetArtifact);
            for (auto const& config :
                 this->GetGlobalNinjaGenerator()->GetDefaultConfigs()) {
              this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
                target.get(), phonyAlias.ExplicitDeps, config,
                DependOnTargetArtifact);
            }
            this->GetGlobalNinjaGenerator()->WriteBuild(
              *this->GetGlobalNinjaGenerator()->GetDefaultFileStream(),
              phonyAlias);
          }
          cmNinjaBuild phonyAlias("phony");
          this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
            target.get(), phonyAlias.Outputs, "all", DependOnTargetArtifact);
          for (auto const& config : this->GetConfigNames()) {
            this->GetGlobalNinjaGenerator()->AppendTargetOutputs(
              target.get(), phonyAlias.ExplicitDeps, config,
              DependOnTargetArtifact);
          }
          this->GetGlobalNinjaGenerator()->WriteBuild(
            *this->GetGlobalNinjaGenerator()->GetDefaultFileStream(),
            phonyAlias);
        }
      } else {
        tg->Generate("");
      }
    }
  }

  for (auto const& config : this->GetConfigNames()) {
    this->WriteCustomCommandBuildStatements(config);
    this->AdditionalCleanFiles(config);
  }
}